

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall
mjs::source_file::source_file
          (source_file *this,wstring_view *filename,wstring_view *text,version ver)

{
  wstring_view *s;
  allocator<wchar_t> local_59;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_58;
  wstring local_40;
  
  this->ver_ = ver;
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&this->filename_,filename,(allocator<wchar_t> *)&local_40);
  if (ver == es3) {
    strip_format_control_characters_abi_cxx11_(&local_40,(mjs *)text,s);
    local_58._M_len = local_40._M_string_length;
    local_58._M_str = local_40._M_dataplus._M_p;
  }
  else {
    local_58._M_len = text->_M_len;
    local_58._M_str = text->_M_str;
  }
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&this->text_,&local_58,&local_59);
  if (ver == es3) {
    std::__cxx11::wstring::~wstring((wstring *)&local_40);
  }
  return;
}

Assistant:

explicit source_file(const std::wstring_view& filename, const std::wstring_view& text, version ver)
        : ver_(ver)
        , filename_(filename)
        , text_(ver == version::es3 ? strip_format_control_characters(text) : text) {
    }